

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Skeleton_blocker_complex.h
# Opt level: O2

void __thiscall
Gudhi::skeleton_blocker::
Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits>::add_neighbours
          (Skeleton_blocker_complex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits> *this,
          Vertex_handle v,Simplex *n,bool keep_only_superior)

{
  pointer psVar1;
  _Base_ptr p_Var2;
  
  psVar1 = (this->skeleton).super_type.m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::setS,_boost::vecS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>,_boost::vecS,_boost::setS,_boost::undirectedS,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_vertex,_Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Graph_edge,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (p_Var2 = *(_Base_ptr *)((long)&psVar1[v.vertex].super_StoredVertex.m_out_edges._M_t + 0x18);
      p_Var2 != (_Rb_tree_node_base *)
                ((long)&psVar1[v.vertex].super_StoredVertex.m_out_edges._M_t + 8U);
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    if ((!keep_only_superior) || (v.vertex < (int)p_Var2[1]._M_color)) {
      Skeleton_blocker_simplex<Gudhi::skeleton_blocker::Skeleton_blocker_simple_traits::Vertex_handle>
      ::add_vertex(n,(Vertex_handle)p_Var2[1]._M_color);
    }
  }
  return;
}

Assistant:

virtual void add_neighbours(Vertex_handle v, Simplex & n,
                              bool keep_only_superior = false) const {
    boost_adjacency_iterator ai, ai_end;
    for (tie(ai, ai_end) = adjacent_vertices(v.vertex, skeleton); ai != ai_end;
         ++ai) {
      Vertex_handle value(*ai);
      if (keep_only_superior) {
        if (value > v.vertex) {
          n.add_vertex(value);
        }
      } else {
        n.add_vertex(value);
      }
    }
  }